

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<std::__cxx11::string,char[6]>
          (string *__return_storage_ptr__,internal *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          char (*param_2) [6])

{
  iu_global_format_stringstream strm;
  undefined1 auStack_198 [128];
  ios_base local_118 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_198);
  detail::
  iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
          (iu_ostream *)(auStack_198 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)auStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}